

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::getRawDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  ushort uVar1;
  UChar UVar2;
  int iVar3;
  UBool UVar4;
  uint16_t norm16_00;
  uint uVar5;
  uint16_t *puVar6;
  uint16_t rm0;
  uint16_t *rawMapping;
  int32_t mLength;
  uint16_t firstUnit;
  uint16_t *mapping;
  uint16_t norm16;
  int32_t *length_local;
  UChar *buffer_local;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  if ((int)(uint)(ushort)this->minDecompNoCP <= c) {
    norm16_00 = getNorm16(this,c);
    UVar4 = isDecompYes(this,norm16_00);
    if (UVar4 == '\0') {
      UVar4 = isHangulLV(this,norm16_00);
      if ((UVar4 != '\0') || (UVar4 = isHangulLVT(this,norm16_00), UVar4 != '\0')) {
        Hangul::getRawDecomposition(c,buffer);
        *length = 2;
        return buffer;
      }
      UVar4 = isDecompNoAlgorithmic(this,norm16_00);
      if (UVar4 != '\0') {
        uVar5 = mapAlgorithmic(this,c,norm16_00);
        *length = 0;
        if (uVar5 < 0x10000) {
          iVar3 = *length;
          *length = iVar3 + 1;
          buffer[iVar3] = (UChar)uVar5;
          return buffer;
        }
        iVar3 = *length;
        *length = iVar3 + 1;
        buffer[iVar3] = (short)((int)uVar5 >> 10) + L'ퟀ';
        iVar3 = *length;
        *length = iVar3 + 1;
        buffer[iVar3] = (UChar)uVar5 & 0x3ffU | 0xdc00;
        return buffer;
      }
      puVar6 = getMapping(this,norm16_00);
      uVar1 = *puVar6;
      uVar5 = uVar1 & 0x1f;
      if ((uVar1 & 0x40) == 0) {
        *length = uVar5;
        return (UChar *)(puVar6 + 1);
      }
      UVar2 = puVar6[-1 - (long)(int)((int)(uint)uVar1 >> 7 & 1)];
      if ((ushort)UVar2 < 0x20) {
        *length = (uint)(ushort)UVar2;
        return (UChar *)(puVar6 + (-1 - (long)(int)((int)(uint)uVar1 >> 7 & 1)) +
                        -(long)(int)(uint)(ushort)UVar2);
      }
      *buffer = UVar2;
      u_memcpy_63(buffer + 1,(UChar *)(puVar6 + 3),uVar5 - 2);
      *length = uVar5 - 1;
      return buffer;
    }
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *
Normalizer2Impl::getRawDecomposition(UChar32 c, UChar buffer[30], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isDecompYes(norm16=getNorm16(c))) {
        // c does not decompose
        return NULL;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        Hangul::getRawDecomposition(c, buffer);
        length=2;
        return buffer;
    } else if(isDecompNoAlgorithmic(norm16)) {
        c=mapAlgorithmic(c, norm16);
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    int32_t mLength=firstUnit&MAPPING_LENGTH_MASK;  // length of normal mapping
    if(firstUnit&MAPPING_HAS_RAW_MAPPING) {
        // Read the raw mapping from before the firstUnit and before the optional ccc/lccc word.
        // Bit 7=MAPPING_HAS_CCC_LCCC_WORD
        const uint16_t *rawMapping=mapping-((firstUnit>>7)&1)-1;
        uint16_t rm0=*rawMapping;
        if(rm0<=MAPPING_LENGTH_MASK) {
            length=rm0;
            return (const UChar *)rawMapping-rm0;
        } else {
            // Copy the normal mapping and replace its first two code units with rm0.
            buffer[0]=(UChar)rm0;
            u_memcpy(buffer+1, (const UChar *)mapping+1+2, mLength-2);
            length=mLength-1;
            return buffer;
        }
    } else {
        length=mLength;
        return (const UChar *)mapping+1;
    }
}